

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::EndTable(void)

{
  ImSpan<ImGuiTableColumn> *this;
  float *pfVar1;
  ImVec2 *pIVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImGuiWindow *window;
  ImGuiWindow *pIVar7;
  ImDrawListSplitter *this_00;
  ImGuiContext *pIVar8;
  bool bVar9;
  int iVar10;
  ImGuiTableInstanceData *pIVar11;
  ImGuiTableColumn *pIVar12;
  ImVec4 *pIVar13;
  uint *puVar14;
  ImGuiTableTempData *pIVar15;
  ImGuiTable *pIVar16;
  int column_n;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_68;
  ImVec2 local_38;
  
  pIVar8 = GImGui;
  pIVar16 = GImGui->CurrentTable;
  if (pIVar16 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Only call EndTable() if BeginTable() returns true!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x4b4,"void ImGui::EndTable()");
  }
  if (pIVar16->IsLayoutLocked == false) {
    TableUpdateLayout(pIVar16);
  }
  window = pIVar16->InnerWindow;
  if (window != pIVar8->CurrentWindow) {
    __assert_fail("inner_window == g.CurrentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x4c3,"void ImGui::EndTable()");
  }
  uVar19 = pIVar16->Flags;
  pIVar7 = pIVar16->OuterWindow;
  pIVar15 = pIVar16->TempData;
  if ((pIVar7 != window) && (pIVar7 != window->ParentWindow)) {
    __assert_fail("outer_window == inner_window || outer_window == inner_window->ParentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x4c4,"void ImGui::EndTable()");
  }
  if (pIVar16->IsInsideRow == true) {
    TableEndRow(pIVar16);
  }
  if (((uVar19 & 0x20) != 0) && (pIVar16->HoveredColumnBody != -1)) {
    bVar9 = IsAnyItemHovered();
    if (!bVar9) {
      bVar9 = IsMouseReleased(1);
      if (bVar9) {
        TableOpenContextMenu((int)pIVar16->HoveredColumnBody);
      }
    }
  }
  pIVar11 = TableGetInstanceData(pIVar16,(int)pIVar16->InstanceCurrent);
  (window->DC).PrevLineSize = pIVar15->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar15->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar15->HostBackupCursorMaxPos;
  fVar3 = pIVar16->RowPosY2;
  pfVar1 = &(window->DC).CursorPos.y;
  if ((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) {
    __assert_fail("table->RowPosY2 == inner_window->DC.CursorPos.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x4d4,"void ImGui::EndTable()");
  }
  if (pIVar7 == window) {
    if ((uVar19 >> 0x11 & 1) == 0) {
      fVar21 = (pIVar16->OuterRect).Max.y;
      uVar18 = -(uint)(fVar3 <= fVar21);
      fVar21 = (float)(~uVar18 & (uint)fVar3 | (uint)fVar21 & uVar18);
      (pIVar16->InnerRect).Max.y = fVar21;
      (pIVar16->OuterRect).Max.y = fVar21;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar3;
  }
  fVar21 = (pIVar16->OuterRect).Max.y;
  fVar20 = (pIVar16->WorkRect).Max.y;
  uVar18 = -(uint)(fVar21 <= fVar20);
  (pIVar16->WorkRect).Max.y = (float)(~uVar18 & (uint)fVar21 | (uint)fVar20 & uVar18);
  pIVar11->LastOuterHeight = fVar21 - (pIVar16->OuterRect).Min.y;
  if (((uint)pIVar16->Flags >> 0x18 & 1) != 0) {
    fVar21 = (pIVar16->InnerWindow->DC).CursorMaxPos.x;
    if (pIVar16->RightMostEnabledColumn != -1) {
      fVar20 = 0.0;
      if (((uint)pIVar16->Flags >> 10 & 1) != 0) {
        fVar20 = 1.0;
      }
      pIVar12 = ImSpan<ImGuiTableColumn>::operator[]
                          (&pIVar16->Columns,(int)pIVar16->RightMostEnabledColumn);
      fVar20 = (pIVar12->WorkMaxX + pIVar16->CellPaddingX + pIVar16->OuterPaddingX) - fVar20;
      uVar18 = -(uint)(fVar20 <= fVar21);
      fVar21 = (float)(uVar18 & (uint)fVar21 | ~uVar18 & (uint)fVar20);
    }
    if (pIVar16->ResizedColumn != -1) {
      uVar18 = -(uint)(pIVar16->ResizeLockMinContentsX2 <= fVar21);
      fVar21 = (float)((uint)fVar21 & uVar18 | ~uVar18 & (uint)pIVar16->ResizeLockMinContentsX2);
    }
    (pIVar16->InnerWindow->DC).CursorMaxPos.x = fVar21;
  }
  if ((uVar19 >> 0x14 & 1) == 0) {
    ImDrawList::PopClipRect(window->DrawList);
  }
  pIVar13 = ImVector<ImVec4>::back(&window->DrawList->_ClipRectStack);
  fVar21 = pIVar13->y;
  fVar20 = pIVar13->z;
  fVar23 = pIVar13->w;
  (window->ClipRect).Min.x = pIVar13->x;
  (window->ClipRect).Min.y = fVar21;
  (window->ClipRect).Max.x = fVar20;
  (window->ClipRect).Max.y = fVar23;
  if ((uVar19 & 0x780) != 0) {
    TableDrawBorders(pIVar16);
  }
  this_00 = pIVar16->DrawSplitter;
  ImDrawListSplitter::SetCurrentChannel(this_00,window->DrawList,0);
  if ((pIVar16->Flags & 0x100000) == 0) {
    TableMergeDrawChannels(pIVar16);
  }
  ImDrawListSplitter::Merge(this_00,window->DrawList);
  this = &pIVar16->Columns;
  local_68 = 0.0;
  local_88 = ZEXT816(0);
  local_98 = ZEXT816(0);
  for (uVar17 = 0; (long)uVar17 < (long)pIVar16->ColumnsCount; uVar17 = uVar17 + 1) {
    if ((pIVar16->EnabledMaskByIndex >> (uVar17 & 0x3f) & 1) != 0) {
      pIVar12 = ImSpan<ImGuiTableColumn>::operator[](this,(int)uVar17);
      uVar19 = pIVar12->Flags;
      if ((uVar19 & 0x30) == 0x10) {
        fVar21 = pIVar12->WidthRequest;
      }
      else {
        fVar21 = TableGetColumnWidthAuto(pIVar16,pIVar12);
      }
      if ((uVar19 & 0x10) == 0) {
        local_88._0_4_ = (float)local_88._0_4_ + fVar21;
      }
      else {
        local_98._0_4_ = (float)local_98._0_4_ + fVar21;
      }
      if ((~uVar19 & 0x28) == 0) {
        fVar21 = fVar21 / (pIVar12->StretchWeight / pIVar16->ColumnsStretchSumWeights);
        uVar19 = -(uint)(fVar21 <= local_68);
        local_68 = (float)(uVar19 & (uint)local_68 | ~uVar19 & (uint)fVar21);
      }
    }
  }
  fVar21 = pIVar16->CellPaddingX + pIVar16->CellPaddingX;
  pIVar16->ColumnsAutoFitWidth =
       (float)(~-(uint)(local_68 <= (float)local_88._0_4_) & (uint)local_68 |
              local_88._0_4_ & -(uint)(local_68 <= (float)local_88._0_4_)) +
       (float)local_98._0_4_ +
       (float)(int)pIVar16->ColumnsEnabledCount * fVar21 +
       pIVar16->OuterPaddingX + pIVar16->OuterPaddingX +
       (float)(pIVar16->ColumnsEnabledCount + -1) *
       (pIVar16->CellSpacingX1 + pIVar16->CellSpacingX2);
  if ((pIVar7 == window) || ((pIVar16->Flags & 0x1000000U) != 0)) {
    if ((pIVar16->LastResizedColumn != -1) &&
       (((pIVar16->ResizedColumn == -1 && (window->ScrollbarX == true)) &&
        (pIVar16->InstanceInteracted == pIVar16->InstanceCurrent)))) {
      fVar21 = fVar21 + pIVar16->MinColumnWidth;
      pIVar12 = ImSpan<ImGuiTableColumn>::operator[](this,(int)pIVar16->LastResizedColumn);
      fVar20 = pIVar12->MaxX;
      if ((pIVar16->InnerClipRect).Min.x <= fVar20) {
        pIVar2 = &(pIVar16->InnerClipRect).Max;
        if (fVar20 < pIVar2->x || fVar20 == pIVar2->x) goto LAB_001858f5;
        fVar21 = fVar21 + (fVar20 - (window->Pos).x);
      }
      else {
        fVar21 = (fVar20 - (window->Pos).x) - fVar21;
      }
      SetScrollFromPosX(window,fVar21,1.0);
    }
  }
  else {
    (window->Scroll).x = 0.0;
  }
LAB_001858f5:
  if ((pIVar16->ResizedColumn != -1) && (pIVar16->InstanceCurrent == pIVar16->InstanceInteracted)) {
    pIVar12 = ImSpan<ImGuiTableColumn>::operator[](this,(int)pIVar16->ResizedColumn);
    pIVar16->ResizedColumnNextWidth =
         (float)(int)((((((pIVar8->IO).MousePos.x - (pIVar8->ActiveIdClickOffset).x) + 4.0) -
                       pIVar12->MinX) - pIVar16->CellSpacingX1) -
                     (pIVar16->CellPaddingX + pIVar16->CellPaddingX));
  }
  puVar14 = ImVector<unsigned_int>::back(&window->IDStack);
  if (*puVar14 != (int)pIVar16->InstanceCurrent + pIVar16->ID) {
    __assert_fail("(inner_window->IDStack.back() == table->ID + table->InstanceCurrent) && \"Mismatching PushID/PopID!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x534,"void ImGui::EndTable()");
  }
  if ((pIVar7->DC).ItemWidthStack.Size < pIVar15->HostBackupItemWidthStackSize) {
    __assert_fail("(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize) && \"Too many PopItemWidth!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x535,"void ImGui::EndTable()");
  }
  PopID();
  fVar21 = (pIVar7->DC).CursorMaxPos.x;
  fVar20 = (pIVar7->DC).CursorMaxPos.y;
  IVar5 = (pIVar15->HostBackupWorkRect).Max;
  (window->WorkRect).Min = (pIVar15->HostBackupWorkRect).Min;
  (window->WorkRect).Max = IVar5;
  IVar5 = (pIVar15->HostBackupParentWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar15->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = IVar5;
  window->SkipItems = pIVar16->HostSkipItems;
  (pIVar7->DC).CursorPos = (pIVar16->OuterRect).Min;
  (pIVar7->DC).ItemWidth = pIVar15->HostBackupItemWidth;
  (pIVar7->DC).ItemWidthStack.Size = pIVar15->HostBackupItemWidthStackSize;
  (pIVar7->DC).ColumnsOffset.x = (pIVar15->HostBackupColumnsOffset).x;
  if (pIVar7 == window) {
    IVar5 = (pIVar16->OuterRect).Min;
    IVar6 = (pIVar16->OuterRect).Max;
    local_38.x = IVar6.x - IVar5.x;
    local_38.y = IVar6.y - IVar5.y;
    ItemSize(&local_38,-1.0);
    ItemAdd(&pIVar16->OuterRect,0,(ImRect *)0x0,0);
  }
  else {
    EndChild();
  }
  uVar19 = pIVar16->Flags;
  if ((uVar19 >> 0x10 & 1) == 0) {
    fVar23 = (pIVar15->UserOuterSize).x;
    fVar22 = 0.0;
    if (fVar23 <= 0.0) {
      if ((uVar19 >> 0x18 & 1) != 0) {
        fVar22 = (window->ScrollbarSizes).x;
      }
      fVar24 = (pIVar16->OuterRect).Min.x + pIVar16->ColumnsAutoFitWidth;
      fVar4 = (pIVar7->DC).IdealMaxPos.x;
      fVar23 = (fVar22 + fVar24) - fVar23;
      uVar18 = -(uint)(fVar23 <= fVar4);
      (pIVar7->DC).IdealMaxPos.x = (float)(uVar18 & (uint)fVar4 | ~uVar18 & (uint)fVar23);
      fVar23 = (pIVar16->OuterRect).Max.x;
      if (fVar24 <= fVar23) {
        fVar23 = fVar24;
      }
    }
    else {
      fVar23 = (pIVar16->OuterRect).Max.x;
    }
  }
  else {
    if ((uVar19 >> 0x18 & 1) != 0) {
      __assert_fail("(table->Flags & ImGuiTableFlags_ScrollX) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                    ,0x554,"void ImGui::EndTable()");
    }
    fVar23 = (pIVar16->OuterRect).Min.x + pIVar16->ColumnsAutoFitWidth;
  }
  uVar18 = -(uint)(fVar23 <= fVar21);
  (pIVar7->DC).CursorMaxPos.x = (float)(~uVar18 & (uint)fVar23 | (uint)fVar21 & uVar18);
  fVar21 = (pIVar15->UserOuterSize).y;
  fVar23 = 0.0;
  if (fVar21 <= 0.0) {
    if ((uVar19 >> 0x19 & 1) != 0) {
      fVar23 = (window->ScrollbarSizes).y;
    }
    fVar22 = (pIVar7->DC).IdealMaxPos.y;
    fVar21 = (fVar23 + fVar3) - fVar21;
    uVar19 = -(uint)(fVar21 <= fVar22);
    (pIVar7->DC).IdealMaxPos.y = (float)(uVar19 & (uint)fVar22 | ~uVar19 & (uint)fVar21);
    fVar21 = (pIVar16->OuterRect).Max.y;
    if (fVar3 <= fVar21) {
      fVar21 = fVar3;
    }
  }
  else {
    fVar21 = (pIVar16->OuterRect).Max.y;
  }
  uVar19 = -(uint)(fVar21 <= fVar20);
  (pIVar7->DC).CursorMaxPos.y = (float)(~uVar19 & (uint)fVar21 | (uint)fVar20 & uVar19);
  if (pIVar16->IsSettingsDirty == true) {
    TableSaveSettings(pIVar16);
  }
  pIVar16->IsInitializing = false;
  if ((pIVar8->CurrentWindow == pIVar7) && (pIVar8->CurrentTable == pIVar16)) {
    iVar10 = pIVar8->TablesTempDataStacked;
    if (0 < iVar10) {
      pIVar8->TablesTempDataStacked = iVar10 + -1;
      if (iVar10 == 1) {
        pIVar8->CurrentTable = (ImGuiTable *)0x0;
        iVar10 = -1;
      }
      else {
        pIVar15 = ImVector<ImGuiTableTempData>::operator[](&pIVar8->TablesTempData,iVar10 + -2);
        pIVar16 = ImVector<ImGuiTable>::operator[](&(pIVar8->Tables).Buf,pIVar15->TableIndex);
        pIVar8->CurrentTable = pIVar16;
        pIVar16->TempData = pIVar15;
        pIVar16->DrawSplitter = &pIVar15->DrawSplitter;
        iVar10 = ImPool<ImGuiTable>::GetIndex(&pIVar8->Tables,pIVar16);
      }
      (pIVar7->DC).CurrentTableIdx = iVar10;
      return;
    }
    __assert_fail("g.TablesTempDataStacked > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x574,"void ImGui::EndTable()");
  }
  __assert_fail("g.CurrentWindow == outer_window && g.CurrentTable == table",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                ,0x573,"void ImGui::EndTable()");
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    ImGuiTableTempData* temp_data = table->TempData;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    inner_window->DC.PrevLineSize = temp_data->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = temp_data->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = temp_data->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table_instance->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    ImDrawListSplitter* splitter = table->DrawSplitter;
    splitter->SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    splitter->Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    float auto_fit_width_for_fixed = 0.0f;
    float auto_fit_width_for_stretched = 0.0f;
    float auto_fit_width_for_stretched_min = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            float column_width_request = ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize)) ? column->WidthRequest : TableGetColumnWidthAuto(table, column);
            if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
                auto_fit_width_for_fixed += column_width_request;
            else
                auto_fit_width_for_stretched += column_width_request;
            if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) && (column->Flags & ImGuiTableColumnFlags_NoResize) != 0)
                auto_fit_width_for_stretched_min = ImMax(auto_fit_width_for_stretched_min, column_width_request / (column->StretchWeight / table->ColumnsStretchSumWeights));
        }
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount + auto_fit_width_for_fixed + ImMax(auto_fit_width_for_stretched, auto_fit_width_for_stretched_min);

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = temp_data->HostBackupWorkRect;
    inner_window->ParentWorkRect = temp_data->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = temp_data->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = temp_data->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = temp_data->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (temp_data->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - temp_data->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (temp_data->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - temp_data->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    IM_ASSERT(g.TablesTempDataStacked > 0);
    temp_data = (--g.TablesTempDataStacked > 0) ? &g.TablesTempData[g.TablesTempDataStacked - 1] : NULL;
    g.CurrentTable = temp_data ? g.Tables.GetByIndex(temp_data->TableIndex) : NULL;
    if (g.CurrentTable)
    {
        g.CurrentTable->TempData = temp_data;
        g.CurrentTable->DrawSplitter = &temp_data->DrawSplitter;
    }
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}